

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_schema.c
# Opt level: O1

int lys_set_implemented(lys_module *module)

{
  byte bVar1;
  byte bVar2;
  lys_module **pplVar3;
  lys_module *plVar4;
  int iVar5;
  unres_schema *unres_00;
  lys_node *plVar6;
  LY_ERR *pLVar7;
  lys_include *plVar8;
  lys_submodule *plVar9;
  lys_node *plVar10;
  char *pcVar11;
  lys_node *plVar12;
  char *format;
  ulong uVar13;
  lys_node *snode;
  long lVar14;
  lys_node *plVar15;
  long lVar16;
  ulong uVar17;
  unres_schema *local_40;
  unres_schema *unres;
  
  if (module == (lys_module *)0x0) {
    pLVar7 = ly_errno_location();
    *pLVar7 = LY_EINVAL;
  }
  else {
    if ((module->field_0x40 & 1) != 0) {
      module = (lys_module *)module->data;
    }
    bVar1 = module->field_0x40;
    if ((bVar1 & 0x40) != 0) {
      lys_set_enabled(module);
    }
    bVar2 = module->field_0x40;
    if ((char)bVar2 < '\0') {
      return 0;
    }
    lVar16 = (long)(module->ctx->models).used;
    unres._7_1_ = bVar1;
    if (0 < lVar16) {
      pplVar3 = (module->ctx->models).list;
      lVar14 = 0;
      do {
        plVar4 = pplVar3[lVar14];
        if (((module != plVar4) && (iVar5 = strcmp(module->name,plVar4->name), iVar5 == 0)) &&
           ((char)plVar4->field_0x40 < '\0')) {
          pLVar7 = ly_errno_location();
          *pLVar7 = LY_EINVAL;
          pcVar11 = module->name;
          format = "Module \"%s\" in another revision already implemented.";
          goto LAB_0015b859;
        }
        lVar14 = lVar14 + 1;
      } while (lVar16 != lVar14);
    }
    unres_00 = (unres_schema *)calloc(1,0x28);
    local_40 = unres_00;
    if (unres_00 == (unres_schema *)0x0) {
      pLVar7 = ly_errno_location();
      *pLVar7 = LY_EMEM;
      format = "Memory allocation failed (%s()).";
      pcVar11 = "lys_set_implemented";
LAB_0015b859:
      ly_log(LY_LLERR,format,pcVar11);
      if ((unres._7_1_ & 0x40) == 0) {
        return 1;
      }
      lys_set_disabled(module);
      return 1;
    }
    module->field_0x40 = bVar2 | 0x80;
    if (module->augment_size != '\0') {
      lVar16 = 0;
      uVar13 = 0;
      do {
        if ((*(long *)(module->augment->padding + lVar16 + 0x3c) == 0) &&
           (iVar5 = unres_schema_add_node
                              (module,unres_00,module->augment->padding + lVar16 + -0x1c,
                               UNRES_AUGMENT,(lys_node *)0x0), iVar5 == -1)) goto LAB_0015b80d;
        uVar13 = uVar13 + 1;
        lVar16 = lVar16 + 0x68;
      } while (uVar13 < module->augment_size);
    }
    for (plVar15 = module->data; snode = plVar15, plVar15 != (lys_node *)0x0;
        plVar15 = plVar15->next) {
      do {
        if (snode->nodetype == LYS_GROUPING) {
LAB_0015b649:
          if (snode == plVar15) break;
          plVar6 = snode->next;
        }
        else {
          if ((((snode->nodetype & (LYS_LEAFLIST|LYS_LEAF)) != LYS_UNKNOWN) &&
              (iVar5._0_2_ = snode[1].flags, iVar5._2_1_ = snode[1].ext_size,
              iVar5._3_1_ = snode[1].iffeature_size, iVar5 == 9)) &&
             (iVar5 = unres_schema_add_node(module,unres_00,&snode[1].ref,UNRES_TYPE_LEAFREF,snode),
             iVar5 == -1)) goto LAB_0015b80d;
          if ((snode->nodetype & (LYS_ANYDATA|LYS_LEAFLIST|LYS_LEAF)) == LYS_UNKNOWN) {
            plVar6 = snode->child;
          }
          else {
            plVar6 = (lys_node *)0x0;
          }
          if (plVar6 == (lys_node *)0x0) goto LAB_0015b649;
        }
        if (plVar6 == (lys_node *)0x0) {
          do {
            if (snode == (lys_node *)0x0) {
LAB_0015b69f:
              snode = (lys_node *)0x0;
            }
            else {
              if (snode->nodetype == LYS_EXT) {
                if (snode->padding[1] != '\x01') goto LAB_0015b69f;
                snode = (lys_node *)snode->dsc;
              }
              else {
                snode = snode->parent;
                if (snode == (lys_node *)0x0) goto LAB_0015b69f;
              }
              if (snode->nodetype == LYS_AUGMENT) {
                snode = snode->prev;
              }
            }
            if (snode == (lys_node *)0x0) {
LAB_0015b6da:
              plVar10 = (lys_node *)0x0;
            }
            else {
              if (snode->nodetype == LYS_EXT) {
                if (snode->padding[1] != '\x01') goto LAB_0015b6da;
                plVar10 = (lys_node *)snode->dsc;
              }
              else {
                plVar10 = snode->parent;
                if (plVar10 == (lys_node *)0x0) goto LAB_0015b6da;
              }
              if (plVar10->nodetype == LYS_AUGMENT) {
                plVar10 = plVar10->prev;
              }
            }
            if (plVar15->nodetype == LYS_EXT) {
              if (plVar15->padding[1] == '\x01') {
                plVar12 = (lys_node *)plVar15->dsc;
                goto LAB_0015b6fa;
              }
LAB_0015b709:
              plVar12 = (lys_node *)0x0;
            }
            else {
              plVar12 = plVar15->parent;
              if (plVar12 == (lys_node *)0x0) goto LAB_0015b709;
LAB_0015b6fa:
              if (plVar12->nodetype == LYS_AUGMENT) {
                plVar12 = plVar12->prev;
              }
            }
          } while ((plVar10 != plVar12) && (plVar6 = snode->next, plVar6 == (lys_node *)0x0));
        }
        snode = plVar6;
      } while (plVar6 != (lys_node *)0x0);
    }
    if (module->inc_size != '\0') {
      uVar13 = 0;
      while (module->inc[uVar13].submodule != (lys_submodule *)0x0) {
        plVar8 = module->inc;
        plVar9 = plVar8[uVar13].submodule;
        if (plVar9->augment_size != '\0') {
          lVar16 = 0;
          lVar14 = 0;
          uVar17 = 0;
          do {
            if ((*(long *)(plVar9->augment->padding + lVar16 + 0x3c) == 0) &&
               (iVar5 = unres_schema_add_node
                                  (*(lys_module **)(plVar8->rev + lVar14 + -8),local_40,
                                   plVar9->augment->padding + lVar16 + -0x1c,UNRES_AUGMENT,
                                   (lys_node *)0x0), iVar5 == -1)) goto LAB_0015b80d;
            uVar17 = uVar17 + 1;
            plVar8 = module->inc;
            plVar9 = plVar8[uVar13].submodule;
            lVar14 = lVar14 + 0x30;
            lVar16 = lVar16 + 0x68;
          } while (uVar17 < plVar9->augment_size);
        }
        uVar13 = uVar13 + 1;
        if (module->inc_size <= uVar13) break;
      }
    }
    if ((local_40->count == 0) || (iVar5 = resolve_unres_schema(module,local_40), iVar5 == 0)) {
      unres_schema_free(module,&local_40);
      return 0;
    }
LAB_0015b80d:
    if ((unres._7_1_ & 0x40) != 0) {
      lys_set_disabled(module);
    }
    module->field_0x40 = module->field_0x40 & 0x7f;
    unres_schema_free(module,&local_40);
  }
  return 1;
}

Assistant:

API int
lys_set_implemented(const struct lys_module *module)
{
    struct ly_ctx *ctx;
    struct unres_schema *unres;
    int i, j, disabled = 0;

    if (!module) {
        ly_errno = LY_EINVAL;
        return EXIT_FAILURE;
    }

    module = lys_main_module(module);

    if (module->disabled) {
        disabled = 1;
        lys_set_enabled(module);
    }

    if (module->implemented) {
        return EXIT_SUCCESS;
    }

    ctx = module->ctx;

    for (i = 0; i < ctx->models.used; ++i) {
        if (module == ctx->models.list[i]) {
            continue;
        }

        if (!strcmp(module->name, ctx->models.list[i]->name) && ctx->models.list[i]->implemented) {
            LOGERR(LY_EINVAL, "Module \"%s\" in another revision already implemented.", module->name);
            if (disabled) {
                /* set it back disabled */
                lys_set_disabled(module);
            }
            return EXIT_FAILURE;
        }
    }

    unres = calloc(1, sizeof *unres);
    if (!unres) {
        LOGMEM;
        if (disabled) {
            /* set it back disabled */
            lys_set_disabled(module);
        }
        return EXIT_FAILURE;
    }
    /* recursively make the module implemented */
    ((struct lys_module *)module)->implemented = 1;
    if (lys_set_implemented_recursion((struct lys_module *)module, unres)) {
        goto error;
    }
    /* process augments in submodules */
    for (i = 0; i < module->inc_size && module->inc[i].submodule; ++i) {
        for (j = 0; j < module->inc[i].submodule->augment_size; j++) {
            /* apply augment */
            if (!module->inc[i].submodule->augment[j].target
                    && (unres_schema_add_node((struct lys_module *)module->inc[j].submodule, unres,
                                              &module->inc[i].submodule->augment[j], UNRES_AUGMENT, NULL) == -1)) {

                goto error;
            }
        }
    }
    /* try again resolve augments in other modules possibly augmenting this one,
     * since we have just enabled it
     */
    /* resolve rest of unres items */
    if (unres->count && resolve_unres_schema((struct lys_module *)module, unres)) {
        goto error;
    }
    unres_schema_free((struct lys_module *)module, &unres);

    return EXIT_SUCCESS;

error:

    if (disabled) {
        /* set it back disabled */
        lys_set_disabled(module);
    }

    ((struct lys_module *)module)->implemented = 0;
    unres_schema_free((struct lys_module *)module, &unres);
    return EXIT_FAILURE;
}